

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_allocate(Integer g_a)

{
  short sVar1;
  int iVar2;
  int iVar3;
  uint dev_flag;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer IVar6;
  int iVar7;
  long lVar8;
  C_Integer *pCVar9;
  logical lVar10;
  Integer *pIVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  size_t __n;
  long lVar17;
  C_Integer CVar18;
  long lVar19;
  long *adj;
  ulong ndims;
  long lVar20;
  long lVar21;
  global_array_t *pgVar22;
  long lVar23;
  Integer IVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int _ndim;
  ulong local_208;
  size_t local_200;
  long local_1f8;
  global_array_t *local_1f0;
  Integer local_1e8;
  long local_1e0;
  Integer hi [7];
  Integer dims [7];
  Integer chunk [7];
  Integer blk [7];
  Integer pe [7];
  Integer width [7];
  
  IVar24 = GAnproc;
  lVar13 = g_a + 1000;
  local_1e8 = GAme;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  lVar28 = lVar13 * 0x368;
  if (GA[lVar13].ndim == -1) {
    pnga_error("Insufficient data to create global array",0);
  }
  iVar7 = GA[lVar13].p_handle;
  if (GA[lVar13].p_handle == GA_Init_Proc_Group) {
    GA[lVar13].p_handle = GA_Default_Proc_Group;
    iVar7 = GA_Default_Proc_Group;
  }
  lVar26 = (long)iVar7;
  pnga_pgroup_sync(lVar26);
  if (0 < iVar7) {
    IVar24 = (Integer)PGRP_LIST[lVar26].map_nproc;
    local_1e8 = (Integer)PGRP_LIST[lVar26].map_proc_list[GAme];
  }
  local_1e0 = lVar26;
  if (GAinitialized == '\0') {
    pnga_error("GA not initialized ",0);
  }
  if (ma_address_init == '\0') {
    gai_ma_address_init();
  }
  pgVar5 = GA;
  sVar1 = GA[lVar13].ndim;
  ndims = (ulong)sVar1;
  if (0 < (long)ndims) {
    memcpy(width,GA[g_a + 1000].width,ndims * 8);
  }
  lVar26 = local_1e0;
  IVar6 = GAnproc;
  pCVar9 = pgVar5[lVar13].mapc;
  if ((pCVar9 == (C_Integer *)0x0) && (pgVar5[lVar13].distr_type == 0)) {
    if (0 < sVar1) {
      uVar12 = 0;
      do {
        dims[uVar12] = pgVar5[g_a + 1000].dims[uVar12];
        chunk[uVar12] = pgVar5[g_a + 1000].chunk[uVar12];
        uVar12 = uVar12 + 1;
      } while (ndims != uVar12);
    }
    if (CONCAT44(chunk[0]._4_4_,(undefined4)chunk[0]) == 0) {
      if (0 < sVar1) {
        memset(blk,0xff,ndims * 8);
      }
    }
    else if (0 < sVar1) {
      uVar12 = 0;
      do {
        lVar25 = dims[uVar12];
        if (chunk[uVar12] < dims[uVar12]) {
          lVar25 = chunk[uVar12];
        }
        blk[uVar12] = lVar25;
        uVar12 = uVar12 + 1;
      } while (ndims != uVar12);
    }
    if (0 < sVar1) {
      uVar12 = 0;
      do {
        if (dims[uVar12] == 1) {
          blk[uVar12] = 1;
        }
        uVar12 = uVar12 + 1;
      } while (ndims != uVar12);
    }
    pnga_pgroup_sync(lVar26);
    if (iVar7 == 0) {
      IVar24 = (long)PGRP_LIST->map_nproc;
    }
    else if (GA[lVar13].num_rstrctd != 0) {
      IVar24 = GA[lVar13].num_rstrctd;
    }
    ddb_h2(ndims,dims,IVar24,0.0,0,blk,pe);
    if (0 < sVar1) {
      uVar12 = 0;
      pIVar11 = mapALL;
      do {
        lVar26 = chunk[uVar12];
        lVar25 = dims[uVar12];
        if (lVar26 < 2) {
          lVar25 = lVar25 - (blk[uVar12] + -1) * pe[uVar12];
        }
        else {
          lVar19 = lVar25;
          if (lVar26 < lVar25) {
            lVar19 = lVar26;
          }
          lVar25 = (lVar25 + -1) / lVar19 + (1 - blk[uVar12]) * pe[uVar12] + 1;
        }
        lVar19 = pe[uVar12];
        if ((lVar19 < 1) || (dims[uVar12] < 1)) {
          lVar16 = 0;
        }
        else {
          lVar8 = 0;
          lVar17 = 0;
          do {
            lVar20 = blk[uVar12] - (ulong)(lVar25 <= lVar8);
            pIVar11[lVar8] = lVar17 + 1;
            if (1 < lVar26) {
              lVar19 = dims[uVar12];
              if (lVar26 < dims[uVar12]) {
                lVar19 = lVar26;
              }
              lVar20 = lVar20 * lVar19;
            }
            lVar16 = lVar8 + 1;
            lVar19 = pe[uVar12];
            if (lVar19 <= lVar16) break;
            lVar17 = lVar17 + lVar20;
            lVar8 = lVar8 + 1;
          } while (lVar17 < dims[uVar12]);
        }
        if (lVar19 < lVar16) {
          lVar16 = lVar19;
        }
        pe[uVar12] = lVar16;
        pIVar11 = pIVar11 + lVar16;
        uVar12 = uVar12 + 1;
      } while (uVar12 != ndims);
    }
    pgVar5 = GA;
    if (sVar1 < 1) {
      lVar26 = 0;
    }
    else {
      uVar12 = 0;
      lVar26 = 0;
      do {
        lVar25 = pe[uVar12];
        pgVar5[g_a + 1000].nblock[uVar12] = (int)lVar25;
        lVar26 = lVar26 + lVar25;
        uVar12 = uVar12 + 1;
      } while (ndims != uVar12);
    }
    pCVar9 = (C_Integer *)malloc(lVar26 * 8 + 8);
    GA[lVar13].mapc = pCVar9;
    pIVar11 = mapALL;
    if (0 < lVar26) {
      pCVar9 = GA[lVar13].mapc;
      lVar25 = 0;
      do {
        pCVar9[lVar25] = pIVar11[lVar25];
        lVar25 = lVar25 + 1;
      } while (lVar26 != lVar25);
    }
    GA[lVar13].mapc[lVar26] = -1;
switchD_0017f21c_default:
    lVar25 = 0;
  }
  else {
    iVar2 = pgVar5[lVar13].distr_type;
    switch(iVar2 - 1U) {
    case 0:
      lVar26 = pgVar5[lVar13].block_total;
      if (GAme < lVar26) {
        uVar12 = ndims & 0xffffffff;
        local_200 = ndims * 8;
        pgVar22 = pgVar5 + g_a;
        lVar25 = 0;
        IVar24 = GAme;
        local_1f8 = lVar28;
        local_1f0 = pgVar22;
        do {
          if (iVar2 - 1U < 3) {
            uVar15 = (long)(int)IVar24 % pgVar5[lVar13].num_blocks[0];
            chunk[0]._0_4_ = (int)uVar15;
            if (1 < sVar1) {
              uVar15 = uVar15 & 0xffffffff;
              lVar19 = 0;
              lVar28 = IVar24;
              do {
                lVar28 = (long)((int)lVar28 - (int)uVar15) / pgVar5[g_a + 1000].num_blocks[lVar19];
                uVar15 = (long)(int)lVar28 % pgVar5[g_a + 1000].num_blocks[lVar19 + 1];
                *(int *)((long)chunk + lVar19 * 4 + 4) = (int)uVar15;
                lVar19 = lVar19 + 1;
              } while (uVar12 - 1 != lVar19);
            }
            if (0 < sVar1) {
              lVar28 = 0;
              do {
                iVar14 = *(int *)((long)chunk + lVar28);
                lVar19 = *(long *)((long)pgVar5[g_a + 1000].block_dims + lVar28 * 2);
                *(long *)((long)dims + lVar28 * 2) = lVar19 * iVar14 + 1;
                lVar19 = ((long)iVar14 + 1) * lVar19;
                *(long *)((long)hi + lVar28 * 2) = lVar19;
                lVar16 = *(long *)((long)pgVar5[g_a + 1000].dims + lVar28 * 2);
                if (lVar16 <= lVar19) {
                  lVar19 = lVar16;
                }
                *(long *)((long)hi + lVar28 * 2) = lVar19;
                lVar28 = lVar28 + 4;
              } while (uVar12 << 2 != lVar28);
            }
          }
          else if (iVar2 == 4) {
            uVar15 = (long)(int)IVar24 % pgVar5[lVar13].num_blocks[0];
            chunk[0]._0_4_ = (int)uVar15;
            if (1 < sVar1) {
              uVar15 = uVar15 & 0xffffffff;
              lVar19 = 0;
              lVar28 = IVar24;
              do {
                lVar28 = (long)((int)lVar28 - (int)uVar15) / pgVar5[g_a + 1000].num_blocks[lVar19];
                uVar15 = (long)(int)lVar28 % pgVar5[g_a + 1000].num_blocks[lVar19 + 1];
                *(int *)((long)chunk + lVar19 * 4 + 4) = (int)uVar15;
                lVar19 = lVar19 + 1;
              } while (uVar12 - 1 != lVar19);
            }
            if (0 < sVar1) {
              pCVar4 = pgVar5[lVar13].mapc;
              lVar28 = 0;
              iVar14 = 0;
              do {
                iVar3 = *(int *)((long)chunk + lVar28);
                lVar19 = (long)iVar14 + (long)iVar3;
                *(C_Integer *)((long)dims + lVar28 * 2) = pCVar4[lVar19];
                if ((long)iVar3 < *(long *)((long)pgVar5[lVar13].num_blocks + lVar28 * 2) + -1) {
                  lVar19 = pCVar9[lVar19 + 1] + -1;
                }
                else {
                  lVar19 = *(long *)((long)pgVar5[lVar13].dims + lVar28 * 2);
                }
                *(long *)((long)hi + lVar28 * 2) = lVar19;
                iVar14 = iVar14 + *(int *)((long)pgVar5[lVar13].num_blocks + lVar28 * 2);
                lVar28 = lVar28 + 4;
              } while (uVar12 << 2 != lVar28);
            }
          }
          else if (iVar2 == 0) {
            if (pgVar5[lVar13].num_rstrctd == 0) {
              lVar28 = 1;
              if (0 < sVar1) {
                uVar15 = 0;
                do {
                  lVar28 = lVar28 * pgVar5[g_a + 1000].nblock[uVar15];
                  uVar15 = uVar15 + 1;
                } while (ndims != uVar15);
              }
              if ((IVar24 < 0) || (lVar28 <= IVar24)) {
LAB_0017f592:
                if (0 < sVar1) {
                  memset(dims,0,local_200);
                  __n = local_200;
LAB_0017f5ec:
                  memset(hi,0xff,__n);
                  pgVar22 = local_1f0;
                }
              }
              else if (0 < sVar1) {
                uVar15 = 0;
                lVar19 = 0;
                lVar28 = IVar24;
                do {
                  lVar8 = (long)pgVar22[1000].nblock[uVar15];
                  lVar16 = lVar28 % lVar8;
                  dims[uVar15] = pCVar9[lVar16 + lVar19];
                  if (lVar16 == lVar8 + -1) {
                    CVar18 = pgVar22[1000].dims[uVar15];
                  }
                  else {
                    CVar18 = pCVar9[lVar16 + lVar19 + 1] + -1;
                  }
                  lVar19 = lVar19 + lVar8;
                  hi[uVar15] = CVar18;
                  uVar15 = uVar15 + 1;
                  lVar28 = lVar28 / lVar8;
                } while (ndims != uVar15);
              }
            }
            else if (IVar24 < pgVar5[lVar13].num_rstrctd) {
              lVar28 = 1;
              if (0 < sVar1) {
                uVar15 = 0;
                do {
                  lVar28 = lVar28 * pgVar5[g_a + 1000].nblock[uVar15];
                  uVar15 = uVar15 + 1;
                } while (ndims != uVar15);
              }
              if ((IVar24 < 0) || (lVar28 <= IVar24)) goto LAB_0017f592;
              if (0 < sVar1) {
                lVar19 = 0;
                uVar15 = 0;
                lVar28 = IVar24;
                do {
                  lVar8 = (long)pgVar22[1000].nblock[uVar15];
                  lVar16 = lVar28 % lVar8;
                  dims[uVar15] = pCVar9[lVar16 + lVar19];
                  if (lVar16 == lVar8 + -1) {
                    CVar18 = pgVar22[1000].dims[uVar15];
                  }
                  else {
                    CVar18 = pCVar9[lVar16 + lVar19 + 1] + -1;
                  }
                  lVar19 = lVar19 + lVar8;
                  hi[uVar15] = CVar18;
                  uVar15 = uVar15 + 1;
                  lVar28 = lVar28 / lVar8;
                } while (ndims != uVar15);
              }
            }
            else if (0 < sVar1) {
              memset(dims,0,uVar12 * 8);
              __n = uVar12 * 8;
              goto LAB_0017f5ec;
            }
          }
          lVar28 = 1;
          if (0 < sVar1) {
            uVar15 = 0;
            do {
              lVar28 = lVar28 * ((hi[uVar15] - dims[uVar15]) + 1);
              uVar15 = uVar15 + 1;
            } while (ndims != uVar15);
          }
          lVar25 = lVar25 + lVar28;
          IVar24 = IVar24 + IVar6;
          lVar28 = local_1f8;
        } while (IVar24 < lVar26);
      }
      else {
        lVar25 = 0;
        local_1f8 = lVar28;
      }
      goto LAB_0017fe1b;
    case 1:
      lVar26 = GAme % (long)pgVar5[lVar13].nblock[0];
      hi[0] = lVar26;
      if (1 < sVar1) {
        lVar25 = 0;
        IVar24 = GAme;
        do {
          IVar24 = (IVar24 - lVar26) / (long)pgVar5[g_a + 1000].nblock[lVar25];
          lVar26 = IVar24 % (long)pgVar5[g_a + 1000].nblock[lVar25 + 1];
          hi[lVar25 + 1] = lVar26;
          lVar25 = lVar25 + 1;
        } while (ndims - 1 != lVar25);
      }
      lVar26 = 1;
      if (0 < sVar1) {
        uVar12 = 0;
        do {
          lVar26 = lVar26 * pgVar5[lVar13].nblock[uVar12];
          uVar12 = uVar12 + 1;
        } while (ndims != uVar12);
      }
      lVar25 = pgVar5[lVar13].num_rstrctd;
      if ((pgVar5[lVar13].num_rstrctd == 0) &&
         (lVar25 = GAnproc, -1 < (long)pgVar5[lVar13].p_handle)) {
        lVar25 = (long)PGRP_LIST[pgVar5[lVar13].p_handle].map_nproc;
      }
      local_1f8 = lVar28;
      if (lVar26 != lVar25) {
        pnga_error("Number of processors in processor grid must equal available processors",0);
      }
      if (0 < sVar1) {
        lVar25 = 1;
        uVar12 = 0;
        do {
          lVar26 = hi[uVar12];
          if (lVar26 < GA[lVar13].num_blocks[uVar12]) {
            lVar21 = (long)GA[lVar13].nblock[uVar12];
            lVar28 = GA[lVar13].dims[uVar12];
            lVar16 = GA[lVar13].block_dims[uVar12];
            lVar17 = lVar16 * (lVar26 + 1);
            lVar19 = ((lVar26 + 1) - lVar21) * lVar16;
            lVar27 = lVar16 * lVar21;
            lVar20 = (lVar21 - lVar26) * lVar16;
            lVar8 = 0;
            do {
              lVar29 = lVar8;
              lVar23 = lVar16 * lVar26;
              lVar8 = lVar28;
              if (lVar17 < lVar28) {
                lVar8 = lVar17;
              }
              lVar26 = lVar26 + lVar21;
              lVar19 = lVar19 + lVar27;
              lVar20 = lVar20 - lVar27;
              lVar17 = lVar17 + lVar27;
              lVar8 = (lVar29 - lVar23) + lVar8;
            } while (lVar26 < GA[lVar13].num_blocks[uVar12]);
            if (lVar28 < lVar19) {
              lVar19 = lVar28;
            }
            lVar19 = lVar20 + lVar29 + lVar19;
            lVar28 = local_1f8;
          }
          else {
            lVar19 = 0;
          }
          lVar25 = lVar25 * lVar19;
          uVar12 = uVar12 + 1;
        } while (uVar12 != ndims);
        goto LAB_0017fe1b;
      }
      break;
    case 2:
      lVar26 = GAme % (long)pgVar5[lVar13].nblock[0];
      hi[0] = lVar26;
      if (1 < sVar1) {
        lVar25 = 0;
        IVar24 = GAme;
        do {
          IVar24 = (IVar24 - lVar26) / (long)pgVar5[g_a + 1000].nblock[lVar25];
          lVar26 = IVar24 % (long)pgVar5[g_a + 1000].nblock[lVar25 + 1];
          hi[lVar25 + 1] = lVar26;
          lVar25 = lVar25 + 1;
        } while (ndims - 1 != lVar25);
      }
      lVar26 = 1;
      if (0 < sVar1) {
        uVar12 = 0;
        do {
          lVar26 = lVar26 * pgVar5[lVar13].nblock[uVar12];
          uVar12 = uVar12 + 1;
        } while (ndims != uVar12);
      }
      lVar25 = pgVar5[lVar13].num_rstrctd;
      if ((pgVar5[lVar13].num_rstrctd == 0) &&
         (lVar25 = GAnproc, -1 < (long)pgVar5[lVar13].p_handle)) {
        lVar25 = (long)PGRP_LIST[pgVar5[lVar13].p_handle].map_nproc;
      }
      local_1f8 = lVar28;
      if (lVar26 != lVar25) {
        pnga_error("Number of processors in processor grid must equal available processors",0);
      }
      if (0 < sVar1) {
        lVar25 = 1;
        uVar12 = 0;
        do {
          lVar26 = hi[uVar12];
          if (lVar26 < GA[lVar13].num_blocks[uVar12]) {
            lVar21 = (long)GA[lVar13].nblock[uVar12];
            lVar28 = GA[lVar13].dims[uVar12];
            lVar16 = GA[lVar13].block_dims[uVar12];
            lVar17 = lVar16 * (lVar26 + 1);
            lVar19 = ((lVar26 + 1) - lVar21) * lVar16;
            lVar27 = lVar16 * lVar21;
            lVar20 = (lVar21 - lVar26) * lVar16;
            lVar8 = 0;
            do {
              lVar23 = lVar8;
              lVar29 = lVar16 * lVar26;
              lVar8 = lVar28;
              if (lVar17 < lVar28) {
                lVar8 = lVar17;
              }
              lVar26 = lVar26 + lVar21;
              lVar19 = lVar19 + lVar27;
              lVar20 = lVar20 - lVar27;
              lVar17 = lVar17 + lVar27;
              lVar8 = (lVar23 - lVar29) + lVar8;
            } while (lVar26 < GA[lVar13].num_blocks[uVar12]);
            if (lVar28 < lVar19) {
              lVar19 = lVar28;
            }
            lVar19 = lVar20 + lVar23 + lVar19;
            lVar28 = local_1f8;
          }
          else {
            lVar19 = 0;
          }
          lVar25 = lVar25 * lVar19;
          uVar12 = uVar12 + 1;
        } while (uVar12 != ndims);
        goto LAB_0017fe1b;
      }
      break;
    case 3:
      lVar26 = GAme % (long)pgVar5[lVar13].nblock[0];
      hi[0] = lVar26;
      if (1 < sVar1) {
        lVar25 = 0;
        IVar24 = GAme;
        do {
          IVar24 = (IVar24 - lVar26) / (long)pgVar5[g_a + 1000].nblock[lVar25];
          lVar26 = IVar24 % (long)pgVar5[g_a + 1000].nblock[lVar25 + 1];
          hi[lVar25 + 1] = lVar26;
          lVar25 = lVar25 + 1;
        } while (ndims - 1 != lVar25);
      }
      lVar26 = 1;
      if (0 < sVar1) {
        uVar12 = 0;
        do {
          lVar26 = lVar26 * pgVar5[lVar13].nblock[uVar12];
          uVar12 = uVar12 + 1;
        } while (ndims != uVar12);
      }
      lVar25 = pgVar5[lVar13].num_rstrctd;
      if ((pgVar5[lVar13].num_rstrctd == 0) &&
         (lVar25 = GAnproc, -1 < (long)pgVar5[lVar13].p_handle)) {
        lVar25 = (long)PGRP_LIST[pgVar5[lVar13].p_handle].map_nproc;
      }
      local_1f8 = lVar28;
      if (lVar26 != lVar25) {
        pnga_error("Number of processors in processor grid must equal available processors",0);
      }
      if (0 < sVar1) {
        lVar25 = 1;
        lVar26 = 0;
        uVar12 = 0;
        do {
          lVar19 = hi[uVar12];
          lVar16 = GA[lVar13].num_blocks[uVar12];
          if (lVar19 < lVar16) {
            lVar8 = 0;
            do {
              if (lVar19 < lVar16 + -1) {
                CVar18 = GA[lVar13].mapc[lVar26 + lVar19 + 1] + -1;
              }
              else {
                CVar18 = GA[lVar13].dims[uVar12];
              }
              lVar8 = (lVar8 - GA[lVar13].mapc[lVar26 + lVar19]) + CVar18 + 1;
              lVar19 = lVar19 + GA[lVar13].nblock[uVar12];
            } while (lVar19 < lVar16);
          }
          else {
            lVar8 = 0;
          }
          lVar25 = lVar25 * lVar8;
          lVar26 = lVar26 + lVar16;
          uVar12 = uVar12 + 1;
        } while (uVar12 != ndims);
        goto LAB_0017fe1b;
      }
      break;
    default:
      goto switchD_0017f21c_default;
    }
    lVar25 = 1;
  }
LAB_0017fe1b:
  GAstat.numcre = GAstat.numcre + 1;
  *(undefined4 *)((long)GA->dims + lVar28 + -0x28) = 1;
  IVar24 = pnga_cluster_nnodes();
  if ((IVar24 == 1) && (*(int *)((long)GA->block_dims + lVar28 + -0x18) == 0)) {
    *(undefined4 *)((long)GA->block_dims + lVar28 + -0x18) = 0xffffffff;
  }
  pgVar5 = GA;
  if (*(int *)((long)GA->block_dims + lVar28 + -4) == 0) {
    if (sVar1 < 1) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      do {
        pgVar5[g_a + 1000].scale[uVar12] =
             (double)pgVar5[g_a + 1000].nblock[uVar12] / (double)pgVar5[g_a + 1000].dims[uVar12];
        uVar12 = uVar12 + 1;
      } while (ndims != uVar12);
    }
    pnga_set_ghost_corner_flag(g_a,uVar12);
    IVar24 = local_1e8;
    if (iVar7 == 0) {
      IVar24 = (Integer)PGRP_LIST->map_proc_list[GAme];
    }
    pnga_distribution(g_a,IVar24,(Integer *)((long)GA->lo + lVar28),hi);
    if ((*(long *)((long)GA->old_nblock + lVar28 + -0x30) == 0) ||
       (*(long *)((long)GA->old_nblock + lVar28 + -0x28) == 1)) {
      if (sVar1 < 1) {
        lVar25 = 1;
      }
      else {
        lVar25 = 1;
        uVar12 = 0;
        do {
          lVar25 = lVar25 * ((hi[uVar12] - GA[g_a + 1000].lo[uVar12]) + width[uVar12] * 2 + 1);
          uVar12 = uVar12 + 1;
        } while (ndims != uVar12);
      }
    }
    else {
      lVar25 = 0;
    }
    lVar25 = *(int *)((long)GA->dims + lVar28 + -0x18) * lVar25;
  }
  else {
    lVar25 = lVar25 * *(int *)((long)GA->dims + lVar28 + -0x18);
    if (0 < sVar1) {
      uVar12 = 0;
      do {
        *(double *)((long)pgVar5->scale + uVar12 * 8 + lVar28) =
             (double)*(long *)((long)pgVar5->num_blocks + uVar12 * 8 + lVar28) /
             (double)*(long *)((long)pgVar5->dims + uVar12 * 8 + lVar28);
        uVar12 = uVar12 + 1;
      } while (ndims != uVar12);
    }
  }
  pgVar5 = GA;
  *(undefined8 *)((long)GA->dims + lVar28 + -8) = 0xffffffffffffffff;
  *(long *)((long)pgVar5->dims + lVar28 + -0x20) = lVar25;
  if (GA_memory_limited == '\x01') {
    GA_total_memory = GA_total_memory - lVar25;
    local_208 = (ulong)~GA_total_memory >> 0x3f;
    IVar24 = pnga_type_f2c(0x3f2);
    if (iVar7 < 1) {
      pnga_gop(IVar24,&local_208,1,"&&");
    }
    else {
      pnga_pgroup_gop(local_1e0,IVar24,&local_208,1,"&&");
    }
  }
  else {
    local_208 = 1;
  }
  if (local_208 == 0) {
    *(undefined8 *)(*(long *)(GA->name + lVar28 + -0x10) + local_1e8 * 8) = 0;
  }
  else {
    adj = (long *)((long)GA->dims + lVar28 + -8);
    dev_flag = *(uint *)(GA->mem_dev + lVar28 + -4);
    iVar2 = *(int *)((long)GA->dims + lVar28 + -0x2c);
    if (dev_flag == 0) {
      iVar7 = gai_get_shmem(*(char ***)(GA->name + lVar28 + -0x10),lVar25,iVar2,adj,iVar7);
    }
    else {
      iVar7 = gai_get_devmem((char *)(ulong)dev_flag,*(char ***)(GA->name + lVar28 + -0x10),lVar25,
                             iVar2,adj,iVar7,dev_flag,GA->mem_dev + lVar28);
    }
    local_208 = (ulong)(iVar7 == 0);
  }
  if (((*(int *)((long)GA->block_dims + lVar28 + -4) == 0) &&
      (*(int *)((long)GA->dims + lVar28 + -0x14) == 1)) &&
     (lVar10 = pnga_set_ghost_info(g_a), lVar10 == 0)) {
    pnga_error("Could not allocate update information for ghost cells",0);
  }
  pnga_pgroup_sync(local_1e0);
  if (local_208 == 0) {
    if (GA_memory_limited == '\x01') {
      GA_total_memory = GA_total_memory + lVar25;
    }
    pnga_destroy(g_a);
    lVar10 = 0;
  }
  else {
    GAstat.curmem = GAstat.curmem + *(long *)((long)GA->dims + lVar28 + -0x20);
    lVar13 = GAstat.curmem;
    if (GAstat.curmem < GAstat.maxmem) {
      lVar13 = GAstat.maxmem;
    }
    lVar10 = 1;
    GAstat.maxmem = lVar13;
  }
  return lVar10;
}

Assistant:

logical pnga_allocate(Integer g_a)
{

  Integer hi[MAXDIM];
  Integer ga_handle = g_a + GA_OFFSET;
  Integer d, width[MAXDIM], ndim;
  Integer mem_size, nelem, pnum;
  Integer i, status, maplen=0, p_handle;
  Integer dims[MAXDIM], chunk[MAXDIM];
  Integer pe[MAXDIM], *pmap[MAXDIM], *map;
  Integer blk[MAXDIM];
  Integer grp_me=GAme, grp_nproc=GAnproc;
  Integer block_size = 0;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  if (GA[ga_handle].ndim == -1)
    pnga_error("Insufficient data to create global array",0);

  p_handle = (Integer)GA[ga_handle].p_handle;
  if (p_handle == (Integer)GA_Init_Proc_Group) {
    GA[ga_handle].p_handle = GA_Default_Proc_Group;
    p_handle = GA_Default_Proc_Group;
  }
  pnga_pgroup_sync(p_handle);

  if (p_handle > 0) {
     grp_nproc  = PGRP_LIST[p_handle].map_nproc;
     grp_me = PGRP_LIST[p_handle].map_proc_list[GAme];
  }
  
  if(!GAinitialized) pnga_error("GA not initialized ", 0);
  if(!ma_address_init) gai_ma_address_init();

  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) width[i] = (C_Integer)GA[ga_handle].width[i];

  /* The data distribution has not been specified by the user. Create
     default distribution */
  if (GA[ga_handle].mapc == NULL && GA[ga_handle].distr_type == REGULAR) {
    for (d=0; d<ndim; d++) {
      dims[d] = (Integer)GA[ga_handle].dims[d];
      chunk[d] = (Integer)GA[ga_handle].chunk[d];
    }
    if(chunk[0]!=0) /* for chunk[0]=0 compute all */
      for(d=0; d< ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for(d=0; d< ndim; d++) blk[d]=-1;

    /* eliminate dimensions =1 from ddb analysis */
    for(d=0; d<ndim; d++)if(dims[d]==1)blk[d]=1;
 
    if (GAme==0 && DEBUG )
      for (d=0;d<ndim;d++) fprintf(stderr,"b[%ld]=%ld\n",(long)d,(long)blk[d]);
    pnga_pgroup_sync(p_handle);

    /* ddb(ndim, dims, GAnproc, blk, pe);*/
    if(p_handle == 0) /* for mirrored arrays */
#if OLD_DISTRIBUTION
       ddb_h2(ndim, dims, PGRP_LIST[p_handle].map_nproc,0.0,(Integer)0, blk, pe);
#else
       ddb(ndim, dims, PGRP_LIST[p_handle].map_nproc, blk, pe);
#endif
    else
       if (GA[ga_handle].num_rstrctd == 0) {
         /* Data is normally distributed on processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, grp_nproc,0.0,(Integer)0, blk, pe);
#else
         ddb(ndim, dims, grp_nproc, blk, pe);
#endif
       } else {
         /* Data is only distributed on subset of processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, GA[ga_handle].num_rstrctd, 0.0, (Integer)0, blk, pe);
#else
         ddb(ndim, dims, GA[ga_handle].num_rstrctd, blk, pe);
#endif
       }

    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       but respect the users block size */
      
      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      }
      else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d]; 
    }
    if(GAme==0&& DEBUG){
      gai_print_subscript("pe ",(int)ndim, pe,"\n");
      gai_print_subscript("blocks ",(int)ndim, blk,"\n");
      printf("decomposition map\n");
      for(d=0; d< ndim; d++){
        printf("dim=%ld: ",(long)d); 
        for (i=0;i<pe[d];i++)printf("%ld ",(long)pmap[d][i]);
        printf("\n"); 
      }
      fflush(stdout);
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    /* Regular block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer nblocks = GA[ga_handle].block_total;
    Integer tsize, j;
    Integer lo[MAXDIM];
    block_size = 0;
    for (i=GAme; i<nblocks; i +=GAnproc) {
      ga_ownsM(ga_handle,i,lo,hi);
      tsize = 1;
      for (j=0; j<ndim; j++) {
        tsize *= (hi[j] - lo[j] + 1);
      }
      block_size += tsize;
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK) {
    /* ScaLAPACK block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    gam_find_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    Integer offset = 0;
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = GA[ga_handle].mapc[offset+j];
        if (j<GA[ga_handle].num_blocks[i]-1) {
          imax = GA[ga_handle].mapc[offset+j+1]-1;
        } else {
          imax = GA[ga_handle].dims[i];
        }
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
      offset += GA[ga_handle].num_blocks[i];
    }
  }

  GAstat.numcre ++;

  GA[ga_handle].actv = 1;
  /* If only one node is being used and array is mirrored,
   * set proc list to world group */
  if (pnga_cluster_nnodes() == 1 && GA[ga_handle].p_handle == 0) {
    GA[ga_handle].p_handle = pnga_pgroup_get_world();
  }

  /* Set remaining parameters and determine memory size if regular data
   * distribution is being used */
  if (GA[ga_handle].distr_type == REGULAR) {
    /* set corner flag, if it has not already been set and set up message
       passing data */
    if (GA[ga_handle].corner_flag == -1) {
       i = 1;
    } else {
       i = GA[ga_handle].corner_flag;
    }
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
         / (double)GA[ga_handle].dims[i];
    }
    pnga_set_ghost_corner_flag(g_a, i);
 
    /*** determine which portion of the array I am supposed to hold ***/
    if (p_handle == 0) { /* for mirrored arrays */
       Integer me_local = (Integer)PGRP_LIST[p_handle].map_proc_list[GAme];
       pnga_distribution(g_a, me_local, GA[ga_handle].lo, hi);
    } else {
       pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    }
    if (GA[ga_handle].num_rstrctd == 0 || GA[ga_handle].has_data == 1) {
      for( i = 0, nelem=1; i< ndim; i++){
        /*
        GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
        */
        nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1+2*width[i]);
      }
    } else {
      nelem = 0;
    }
    mem_size = nelem * GA[ga_handle].elemsize;
  } else {
    mem_size = block_size * GA[ga_handle].elemsize;
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].num_blocks[i]
         / (double)GA[ga_handle].dims[i];
    }
  }
  GA[ga_handle].id = INVALID_MA_HANDLE;
  GA[ga_handle].size = (C_Long)mem_size;
  /* if requested, enforce limits on memory consumption */
  if(GA_memory_limited) GA_total_memory -= mem_size;
  /* check if everybody has enough memory left */
  if(GA_memory_limited){
     status = (GA_total_memory >= 0) ? 1 : 0;
     if (p_handle > 0) {
        /* pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
        pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
     } else {
        /* pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
        pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
     }
  }else status = 1;

  if (status) {
    if (GA[ga_handle].mem_dev_set) {
      status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
          GA[ga_handle].type, &GA[ga_handle].id, p_handle,
          GA[ga_handle].mem_dev_set, GA[ga_handle].mem_dev);
    } else {
      status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
          GA[ga_handle].type, &GA[ga_handle].id, p_handle);
    }
  } else {
     GA[ga_handle].ptr[grp_me]=NULL;
  }

  if (GA[ga_handle].distr_type == REGULAR) {
    /* Finish setting up information for ghost cell updates */
    if (GA[ga_handle].ghosts == 1) {
      if (!pnga_set_ghost_info(g_a))
        pnga_error("Could not allocate update information for ghost cells",0);
    }
    /* If array is mirrored, evaluate first and last indices */
    /* ngai_get_first_last_indices(&g_a); */
  }

  pnga_pgroup_sync(p_handle);
  if (status) {
    GAstat.curmem += (long)GA[ga_handle].size;
    GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);
    status = TRUE;
  } else {
    if(GA_memory_limited) GA_total_memory += mem_size;
    pnga_destroy(g_a);
    status = FALSE;
  }
  return status;
}